

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

bool __thiscall
graph_impl::
Graph<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>_>
::AddEdge(Graph<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>_>
          *this,EdgeType *edge)

{
  mapped_type *pmVar1;
  pair<std::_Rb_tree_const_iterator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_bool>
  pVar2;
  ThisType local_f8;
  _Base_ptr local_b8;
  byte local_b0;
  ThisType local_a8;
  _Base_ptr local_78;
  byte local_70;
  _Base_ptr local_68;
  byte local_60;
  _Base_ptr local_58;
  byte local_50;
  _Base_ptr local_48;
  byte local_40;
  _Base_ptr local_38;
  byte local_30;
  byte local_21;
  EdgeType *pEStack_20;
  bool res;
  EdgeType *edge_local;
  Graph<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>_>
  *this_local;
  
  pEStack_20 = edge;
  edge_local = (EdgeType *)this;
  AddNode(this,&edge->from);
  AddNode(this,&pEStack_20->to);
  pmVar1 = std::
           map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
           ::operator[](&this->edges_,&pEStack_20->from);
  pVar2 = std::
          set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>
          ::insert(pmVar1,pEStack_20);
  local_48 = (_Base_ptr)pVar2.first._M_node;
  local_40 = pVar2.second;
  local_21 = local_40 & 1;
  this_local._7_1_ = (bool)local_21;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_38 = local_48;
    local_30 = local_40;
    pmVar1 = std::
             map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
             ::operator[](&this->edges_,&pEStack_20->to);
    pVar2 = std::
            set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>
            ::insert(pmVar1,pEStack_20);
    local_68 = (_Base_ptr)pVar2.first._M_node;
    local_60 = pVar2.second;
    local_21 = (local_21 | local_60) & 1;
    local_58 = local_68;
    local_50 = local_60;
    pmVar1 = std::
             map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
             ::operator[](&this->edges_,&pEStack_20->from);
    Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>::ReversedCopy
              (&local_a8,pEStack_20);
    pVar2 = std::
            set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>
            ::insert(pmVar1,&local_a8);
    local_b8 = (_Base_ptr)pVar2.first._M_node;
    local_b0 = pVar2.second;
    local_21 = (local_21 | local_b0) & 1;
    local_78 = local_b8;
    local_70 = local_b0;
    pmVar1 = std::
             map<graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>,_std::less<graph_tests::PointOnMap>,_std::allocator<std::pair<const_graph_tests::PointOnMap,_std::set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>_>_>_>
             ::operator[](&this->edges_,&pEStack_20->to);
    Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>::ReversedCopy
              (&local_f8,pEStack_20);
    pVar2 = std::
            set<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>,_std::less<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>,_std::allocator<graph_impl::Edge<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>_>_>_>
            ::insert(pmVar1,&local_f8);
    this_local._7_1_ =
         (local_21 & 1) != 0 ||
         ((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  }
  return this_local._7_1_;
}

Assistant:

bool AddEdge(const EdgeType& edge) {
    // TODO: clean up this mess
    AddNode(edge.from);
    AddNode(edge.to);
    if constexpr (graph_meta::contains_type_v<
                      graph::Multigraph, GraphTraits...>) {
      edges_[edge.from].insert(edge);
      edges_[edge.to].insert(edge);
      if constexpr (!graph_meta::contains_type_v<
                        graph::Directed, GraphTraits...>) {
        edges_[edge.from].insert(edge.ReversedCopy());
        edges_[edge.to].insert(edge.ReversedCopy());
      }
      return true;
    } else {
      bool res = edges_[edge.from].insert(edge).second;
      if (!res) return res;
      res |= edges_[edge.to].insert(edge).second;
      if constexpr (!graph_meta::contains_type_v<
                        graph::Directed, GraphTraits...>) {
        res |= edges_[edge.from].insert(edge.ReversedCopy()).second;
        res |= edges_[edge.to].insert(edge.ReversedCopy()).second;
      }
      return res;
    }
  }